

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shader.h
# Opt level: O0

bool __thiscall Diligent::ShaderCreateInfo::operator==(ShaderCreateInfo *this,ShaderCreateInfo *RHS)

{
  bool bVar1;
  int iVar2;
  ShaderCreateInfo *CI2;
  ShaderCreateInfo *CI1;
  ShaderCreateInfo *RHS_local;
  ShaderCreateInfo *this_local;
  
  bVar1 = SafeStrEqual(this->FilePath,RHS->FilePath);
  if (bVar1) {
    bVar1 = SafeStrEqual(this->Source,RHS->Source);
    if (bVar1) {
      if ((this->field_4).SourceLength == (RHS->field_4).SourceLength) {
        if ((this->ByteCode != (void *)0x0) == (RHS->ByteCode != (void *)0x0)) {
          if (((this->ByteCode == (void *)0x0) || (RHS->ByteCode == (void *)0x0)) ||
             (iVar2 = memcmp(this->ByteCode,RHS->ByteCode,(this->field_4).SourceLength), iVar2 == 0)
             ) {
            bVar1 = SafeStrEqual(this->EntryPoint,RHS->EntryPoint);
            if (bVar1) {
              bVar1 = ShaderMacroArray::operator!=(&this->Macros,&RHS->Macros);
              if (bVar1) {
                this_local._7_1_ = false;
              }
              else {
                bVar1 = ShaderDesc::operator!=(&this->Desc,&RHS->Desc);
                if (bVar1) {
                  this_local._7_1_ = false;
                }
                else if (this->SourceLanguage == RHS->SourceLanguage) {
                  if (this->ShaderCompiler == RHS->ShaderCompiler) {
                    bVar1 = Version::operator!=(&this->HLSLVersion,&RHS->HLSLVersion);
                    if (((bVar1) ||
                        (bVar1 = Version::operator!=(&this->GLSLVersion,&RHS->GLSLVersion), bVar1))
                       || ((bVar1 = Version::operator!=(&this->GLESSLVersion,&RHS->GLESSLVersion),
                           bVar1 || (bVar1 = Version::operator!=(&this->MSLVersion,&RHS->MSLVersion)
                                    , bVar1)))) {
                      this_local._7_1_ = false;
                    }
                    else if (this->CompileFlags == RHS->CompileFlags) {
                      if ((this->LoadConstantBufferReflection & 1U) ==
                          (RHS->LoadConstantBufferReflection & 1U)) {
                        bVar1 = SafeStrEqual(this->GLSLExtensions,RHS->GLSLExtensions);
                        if (bVar1) {
                          bVar1 = SafeStrEqual(this->WebGPUEmulatedArrayIndexSuffix,
                                               RHS->WebGPUEmulatedArrayIndexSuffix);
                          if (bVar1) {
                            this_local._7_1_ = true;
                          }
                          else {
                            this_local._7_1_ = false;
                          }
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const ShaderCreateInfo& RHS) const noexcept
    {
        const auto& CI1 = *this;
        const auto& CI2 = RHS;

        if (!SafeStrEqual(CI1.FilePath, CI2.FilePath))
            return false;

        //if (CI1.FilePath != nullptr && CI1.pShaderSourceStreamFactory != CI2.pShaderSourceStreamFactory)
        //    return false;

        if (!SafeStrEqual(CI1.Source, CI2.Source))
            return false;

        if (CI1.SourceLength != CI2.SourceLength)
            return false;

        if ((CI1.ByteCode != nullptr) != (CI2.ByteCode != nullptr))
            return false;

        if ((CI1.ByteCode != nullptr) && (CI2.ByteCode != nullptr))
        {
            if (memcmp(CI1.ByteCode, CI2.ByteCode, CI1.ByteCodeSize) != 0)
                return false;
        }

        if (!SafeStrEqual(CI1.EntryPoint, CI2.EntryPoint))
            return false;

        if (CI1.Macros != CI2.Macros)
            return false;

        if (CI1.Desc != CI2.Desc)
            return false;

        if (CI1.SourceLanguage != CI2.SourceLanguage)
            return false;

        if (CI1.ShaderCompiler != CI2.ShaderCompiler)
            return false;

        if ((CI1.HLSLVersion != CI2.HLSLVersion ||
             CI1.GLSLVersion != CI2.GLSLVersion ||
             CI1.GLESSLVersion != CI2.GLESSLVersion ||
             CI1.MSLVersion != CI2.MSLVersion))
            return false;

        if (CI1.CompileFlags != CI2.CompileFlags)
            return false;

        if (CI1.LoadConstantBufferReflection != CI2.LoadConstantBufferReflection)
            return false;

        if (!SafeStrEqual(CI1.GLSLExtensions, CI2.GLSLExtensions))
            return false;

        if (!SafeStrEqual(CI1.WebGPUEmulatedArrayIndexSuffix, CI2.WebGPUEmulatedArrayIndexSuffix))
            return false;

        return true;
    }